

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
copyChildNodesToNode
          (UA_Server *server,UA_Session *session,UA_NodeId *sourceNodeId,
          UA_NodeId *destinationNodeId,UA_InstantiationCallback *instantiationCallback)

{
  UA_Node *pUVar1;
  UA_UInt16 UVar2;
  UA_NodeClass UVar3;
  UA_NodeStoreEntry *pUVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined4 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined4 uVar16;
  UA_NodeId UVar17;
  UA_NodeId UVar18;
  UA_Boolean UVar19;
  int iVar20;
  UA_StatusCode UVar21;
  UA_NodeStoreEntry **ppUVar22;
  UA_Node *pUVar23;
  size_t sVar24;
  undefined8 uVar25;
  UA_ExpandedNodeId *nodeid;
  UA_DataType *type;
  UA_DataValue *v;
  ulong uVar26;
  UA_ReferenceDescription *pUVar27;
  UA_NodeId *n2;
  undefined8 *puVar28;
  UA_BrowseDescription local_348;
  UA_BrowseResult local_2f8;
  undefined1 auStack_2c8 [8];
  UA_NodeId mandatoryId;
  UA_PublishResponseEntry *local_1c8;
  UA_PublishResponseEntry **ppUStack_1c0;
  anon_union_16_4_621dfe33_for_identifier local_1b8;
  undefined1 auStack_1a8 [8];
  UA_NodeId id_1;
  undefined1 auStack_d8 [8];
  UA_DataValue value;
  
  local_348._68_4_ = 0;
  local_348.referenceTypeId.identifier.string.length._4_4_ = 0;
  local_348.referenceTypeId.identifier.string.data = (UA_Byte *)0x0;
  local_348.referenceTypeId._2_2_ = 0;
  local_348.nodeId.namespaceIndex = sourceNodeId->namespaceIndex;
  local_348.nodeId._2_2_ = *(undefined2 *)&sourceNodeId->field_0x2;
  local_348.nodeId.identifierType = sourceNodeId->identifierType;
  local_348.nodeId.identifier.string.length = (sourceNodeId->identifier).string.length;
  local_348.nodeId.identifier.string.data = (sourceNodeId->identifier).string.data;
  local_348.referenceTypeId.namespaceIndex = 0;
  local_348.referenceTypeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  local_348.referenceTypeId.identifier.numeric = 0x2c;
  local_348.includeSubtypes = true;
  local_348._57_3_ = 0;
  local_348.browseDirection = UA_BROWSEDIRECTION_FORWARD;
  local_348._28_4_ = 0;
  local_348.nodeClassMask = 7;
  local_348.resultMask = 0xd;
  local_2f8.continuationPoint.data = (UA_Byte *)0x0;
  local_2f8.referencesSize = 0;
  local_2f8.statusCode = 0;
  local_2f8._4_4_ = 0;
  local_2f8.continuationPoint.length = 0;
  local_2f8.references = (UA_ReferenceDescription *)0x0;
  Service_Browse_single(server,session,(ContinuationPointEntry *)0x0,&local_348,0,&local_2f8);
  if (local_2f8.statusCode != 0) {
    return local_2f8.statusCode;
  }
  UVar21 = 0;
  value.serverPicoseconds = 0;
  value._90_6_ = 0;
  if (local_2f8.referencesSize != 0) {
    uVar26 = 0;
LAB_0012b57b:
    pUVar27 = local_2f8.references;
    nodeid = &local_2f8.references[uVar26].nodeId;
    auStack_2c8._0_2_ = 0;
    auStack_2c8._4_4_ = UA_NODEIDTYPE_NUMERIC;
    mandatoryId.namespaceIndex = 0x4e;
    mandatoryId._2_2_ = 0;
    auStack_1a8._0_2_ = 0;
    auStack_1a8._4_4_ = UA_NODEIDTYPE_NUMERIC;
    id_1.namespaceIndex = 0x25;
    id_1._2_2_ = 0;
    ppUVar22 = findNode(server->nodestore,&nodeid->nodeId);
    if (ppUVar22 != (UA_NodeStoreEntry **)0x0) {
      sVar24 = ((*ppUVar22)->node).referencesSize;
      if (sVar24 != 0) {
        pUVar27 = pUVar27 + uVar26;
        n2 = &((((*ppUVar22)->node).references)->targetId).nodeId;
        do {
          UVar19 = UA_NodeId_equal((UA_NodeId *)auStack_1a8,
                                   (UA_NodeId *)((long)&n2[-2].identifier + 8));
          if (((UVar19) && (UVar19 = UA_NodeId_equal((UA_NodeId *)auStack_2c8,n2), UVar19)) &&
             (n2[-1].identifier.guid.data4[0] != '\x01')) {
            mandatoryId.identifier.string.data = (UA_Byte *)0x0;
            mandatoryId.identifier.string.length =
                 (size_t)(destinationNodeId->identifier).string.data;
            uVar5 = destinationNodeId->namespaceIndex;
            uVar6 = *(undefined2 *)&destinationNodeId->field_0x2;
            uVar7 = destinationNodeId->identifierType;
            sVar24 = (destinationNodeId->identifier).string.length;
            mandatoryId._0_4_ = SUB84(sVar24,0);
            mandatoryId.identifierType = (UA_NodeIdType)(sVar24 >> 0x20);
            id_1.identifier.string.length = 0;
            id_1.identifier.string.data = (UA_Byte *)0x0;
            auStack_1a8._0_2_ = 0;
            auStack_1a8._2_2_ = 0;
            auStack_1a8._4_4_ = UA_NODEIDTYPE_NUMERIC;
            id_1.namespaceIndex = 0;
            id_1._2_2_ = 0;
            id_1.identifierType = UA_NODEIDTYPE_NUMERIC;
            v = (UA_DataValue *)0x0;
            auStack_2c8._0_2_ = uVar5;
            auStack_2c8._2_2_ = uVar6;
            auStack_2c8._4_4_ = uVar7;
            Service_Browse_single
                      (server,session,(ContinuationPointEntry *)0x0,
                       (UA_BrowseDescription *)auStack_2c8,0,(UA_BrowseResult *)auStack_1a8);
            UVar21 = CONCAT22(auStack_1a8._2_2_,auStack_1a8._0_2_);
            if (UVar21 != 0) goto LAB_0012be02;
            if (id_1.identifier.string.data == (UA_Byte *)0x0) goto LAB_0012b729;
            UVar2 = (pUVar27->browseName).namespaceIndex;
            puVar28 = (undefined8 *)0x60;
            uVar25 = id_1.identifier.string.data;
            goto LAB_0012b6f8;
          }
          n2 = (UA_NodeId *)&n2[3].identifier;
          sVar24 = sVar24 - 1;
        } while (sVar24 != 0);
      }
    }
    goto LAB_0012b62a;
  }
LAB_0012be02:
  deleteMembers_noInit(&local_2f8,UA_TYPES + 0x98);
  return UVar21;
  while( true ) {
    puVar28 = puVar28 + 0x18;
    uVar25 = uVar25 + -1;
    if ((UA_Byte *)uVar25 == (UA_Byte *)0x0) break;
LAB_0012b6f8:
    if (((*(UA_UInt16 *)(puVar28 + -2) == UVar2) &&
        (puVar28[-1] == (pUVar27->browseName).name.length)) &&
       (iVar20 = bcmp((void *)*puVar28,(pUVar27->browseName).name.data,puVar28[-1]), iVar20 == 0)) {
      UVar21 = UA_copy(puVar28 + -8,&value.serverPicoseconds,UA_TYPES + 0x10);
      deleteMembers_noInit(auStack_1a8,UA_TYPES + 0x98);
      if (UVar21 == 0) goto LAB_0012b73c;
      goto LAB_0012be02;
    }
  }
LAB_0012b729:
  deleteMembers_noInit(auStack_1a8,UA_TYPES + 0x98);
LAB_0012b73c:
  UVar19 = UA_NodeId_equal(&UA_NODEID_NULL,(UA_NodeId *)&value.serverPicoseconds);
  UVar3 = pUVar27->nodeClass;
  if (UVar19) {
    if (UVar3 == UA_NODECLASS_OBJECT) {
      ppUVar22 = findNode(server->nodestore,&nodeid->nodeId);
      if (ppUVar22 == (UA_NodeStoreEntry **)0x0) {
        UVar21 = 0x80330000;
        goto LAB_0012be02;
      }
      pUVar4 = *ppUVar22;
      if ((pUVar4->node).nodeClass != UA_NODECLASS_OBJECT) {
        UVar21 = 0x805f0000;
        goto LAB_0012be02;
      }
      pUVar1 = &pUVar4->node;
      auStack_1a8._0_2_ = 0;
      auStack_1a8._2_2_ = 0;
      auStack_1a8._4_4_ = UA_NODEIDTYPE_NUMERIC;
      sVar24 = (pUVar4->node).displayName.locale.length;
      id_1.identifier.string.length = (size_t)(pUVar4->node).displayName.locale.data;
      id_1.identifier.string.data = (UA_Byte *)(pUVar4->node).displayName.text.length;
      id_1._0_4_ = SUB84(sVar24,0);
      id_1.identifierType = (UA_NodeIdType)(sVar24 >> 0x20);
      memset((void *)((long)&mandatoryId.identifier + 8),0,0xe0);
      mandatoryId.identifier.string.length = (size_t)(destinationNodeId->identifier).string.data;
      uVar14 = destinationNodeId->namespaceIndex;
      uVar15 = *(undefined2 *)&destinationNodeId->field_0x2;
      uVar16 = destinationNodeId->identifierType;
      sVar24 = (destinationNodeId->identifier).string.length;
      mandatoryId._0_4_ = SUB84(sVar24,0);
      mandatoryId.identifierType = (UA_NodeIdType)(sVar24 >> 0x20);
      auStack_2c8._0_2_ = uVar14;
      auStack_2c8._2_2_ = uVar15;
      auStack_2c8._4_4_ = uVar16;
      pUVar23 = getNodeType(server,pUVar1);
      UVar21 = 0x80630000;
      if (((pUVar23 != (UA_Node *)0x0) && (pUVar23->nodeClass == UA_NODECLASS_OBJECTTYPE)) &&
         ((char)pUVar23[1].nodeId.namespaceIndex == '\0')) {
        value.value.type = (UA_DataType *)0x0;
        value.value.storageType = UA_VARIANT_DATA;
        value.value._12_4_ = 0;
        auStack_d8 = (undefined1  [8])0x0;
        value._0_8_ = 0;
        Service_AddNodes_single
                  (server,session,(UA_AddNodesItem *)auStack_2c8,(UA_AddNodesResult *)auStack_d8,
                   instantiationCallback);
        UVar21 = auStack_d8._0_4_;
        if (auStack_d8._0_4_ == 0) {
          UVar21 = copyChildNodesToNode
                             (server,session,&pUVar1->nodeId,(UA_NodeId *)&value,
                              instantiationCallback);
          if ((instantiationCallback != (UA_InstantiationCallback *)0x0) && (UVar21 == 0)) {
            UVar18.identifier.string.length = (size_t)value.value.type;
            UVar18.namespaceIndex = value._0_2_;
            UVar18._2_2_ = value._2_2_;
            UVar18.identifierType = value._4_4_;
            UVar18.identifier.string.data = (UA_Byte *)value.value._8_8_;
            (*instantiationCallback->method)(UVar18,pUVar1->nodeId,instantiationCallback->handle);
          }
          type = UA_TYPES + 0x10;
LAB_0012bde1:
          deleteMembers_noInit(&value,type);
        }
      }
    }
    else if (UVar3 == UA_NODECLASS_VARIABLE) {
      ppUVar22 = findNode(server->nodestore,&nodeid->nodeId);
      if (ppUVar22 == (UA_NodeStoreEntry **)0x0) {
        UVar21 = 0x80330000;
      }
      else {
        pUVar4 = *ppUVar22;
        UVar21 = 0x805f0000;
        if ((pUVar4->node).nodeClass == UA_NODECLASS_VARIABLE) {
          pUVar1 = &pUVar4->node;
          value.sourcePicoseconds = 0;
          value._74_6_ = 0;
          value.serverTimestamp = 0;
          value.status = 0;
          value._60_4_ = 0;
          value.sourceTimestamp = 0;
          value.value.arrayDimensionsSize = 0;
          value.value.arrayDimensions = (UA_UInt32 *)0x0;
          value.value.arrayLength = 0;
          value.value.data = (void *)0x0;
          value.value.type = (UA_DataType *)0x0;
          value.value.storageType = UA_VARIANT_DATA;
          value.value._12_4_ = 0;
          auStack_d8 = (undefined1  [8])0x0;
          value._0_8_ = 0;
          UVar21 = readValueAttributeComplete
                             ((UA_Server *)pUVar1,(UA_VariableNode *)0x3,
                              UA_TIMESTAMPSTORETURN_SOURCE,(UA_String *)auStack_d8,v);
          if (UVar21 == 0) {
            memset(auStack_1a8,0,200);
            sVar24 = (pUVar4->node).displayName.locale.length;
            id_1.identifier.string.length = (size_t)(pUVar4->node).displayName.locale.data;
            id_1.identifier.string.data = (UA_Byte *)(pUVar4->node).displayName.text.length;
            id_1._0_4_ = SUB84(sVar24,0);
            id_1.identifierType = (UA_NodeIdType)(sVar24 >> 0x20);
            memset((void *)((long)&mandatoryId.identifier + 8),0,0xe0);
            mandatoryId.identifier.string.length =
                 (size_t)(destinationNodeId->identifier).string.data;
            uVar11 = destinationNodeId->namespaceIndex;
            uVar12 = *(undefined2 *)&destinationNodeId->field_0x2;
            uVar13 = destinationNodeId->identifierType;
            sVar24 = (destinationNodeId->identifier).string.length;
            mandatoryId._0_4_ = SUB84(sVar24,0);
            mandatoryId.identifierType = (UA_NodeIdType)(sVar24 >> 0x20);
            auStack_2c8._0_2_ = uVar11;
            auStack_2c8._2_2_ = uVar12;
            auStack_2c8._4_4_ = uVar13;
            pUVar23 = getNodeType(server,pUVar1);
            UVar21 = 0x80630000;
            if (((pUVar23 != (UA_Node *)0x0) && (pUVar23->nodeClass == UA_NODECLASS_VARIABLETYPE))
               && ((char)pUVar23[2].browseName.namespaceIndex == '\0')) {
              local_1b8.string.length = 0;
              local_1b8.string.data = (UA_Byte *)0x0;
              local_1c8 = (UA_PublishResponseEntry *)0x0;
              ppUStack_1c0 = (UA_PublishResponseEntry **)0x0;
              Service_AddNodes_single
                        (server,session,(UA_AddNodesItem *)auStack_2c8,
                         (UA_AddNodesResult *)&local_1c8,instantiationCallback);
              UVar21 = (UA_StatusCode)local_1c8;
              if ((UA_StatusCode)local_1c8 == 0) {
                UVar21 = copyChildNodesToNode
                                   (server,session,&pUVar1->nodeId,(UA_NodeId *)&ppUStack_1c0,
                                    instantiationCallback);
                if ((instantiationCallback != (UA_InstantiationCallback *)0x0) && (UVar21 == 0)) {
                  UVar17.identifier.string.length = local_1b8.string.length;
                  UVar17._0_8_ = ppUStack_1c0;
                  UVar17.identifier.string.data = local_1b8.string.data;
                  (*instantiationCallback->method)
                            (UVar17,pUVar1->nodeId,instantiationCallback->handle);
                }
                deleteMembers_noInit((UA_NodeId *)&ppUStack_1c0,UA_TYPES + 0x10);
                ppUStack_1c0 = (UA_PublishResponseEntry **)0x0;
                local_1b8.string.length = 0;
                local_1b8.string.data = (UA_Byte *)0x0;
              }
            }
            if ((((ulong)auStack_d8 & 1) != 0) && ((int)value.value.type == 0)) {
              type = UA_TYPES + 0x17;
              goto LAB_0012bde1;
            }
          }
        }
      }
    }
    else {
      if (UVar3 != UA_NODECLASS_METHOD) goto LAB_0012b62a;
      mandatoryId.identifier.string.length = (size_t)(destinationNodeId->identifier).string.data;
      uVar8 = destinationNodeId->namespaceIndex;
      uVar9 = *(undefined2 *)&destinationNodeId->field_0x2;
      uVar10 = destinationNodeId->identifierType;
      sVar24 = (destinationNodeId->identifier).string.length;
      mandatoryId._0_4_ = SUB84(sVar24,0);
      mandatoryId.identifierType = (UA_NodeIdType)(sVar24 >> 0x20);
      mandatoryId.identifier.string.data = (UA_Byte *)*(undefined8 *)&pUVar27->referenceTypeId;
      auStack_2c8._0_2_ = uVar8;
      auStack_2c8._2_2_ = uVar9;
      auStack_2c8._4_4_ = uVar10;
      UVar21 = addReference(server,(UA_Session *)auStack_2c8,
                            (UA_AddReferencesItem *)((long)&mandatoryId.identifier + 8));
    }
  }
  else {
    UVar21 = 0;
    if (UVar3 - UA_NODECLASS_OBJECT < 2) {
      UVar19 = UA_NodeId_equal(&nodeid->nodeId,(UA_NodeId *)&value.serverPicoseconds);
      if (!UVar19) {
        UVar21 = copyChildNodesToNode
                           (server,session,&nodeid->nodeId,(UA_NodeId *)&value.serverPicoseconds,
                            instantiationCallback);
      }
    }
    deleteMembers_noInit(&value.serverPicoseconds,UA_TYPES + 0x10);
    value.serverPicoseconds = 0;
    value._90_6_ = 0;
  }
  if (UVar21 != 0) goto LAB_0012be02;
LAB_0012b62a:
  uVar26 = uVar26 + 1;
  if (local_2f8.referencesSize <= uVar26) goto LAB_0012be00;
  goto LAB_0012b57b;
LAB_0012be00:
  UVar21 = 0;
  goto LAB_0012be02;
}

Assistant:

static UA_StatusCode
copyChildNodesToNode(UA_Server* server, UA_Session* session,
                     const UA_NodeId* sourceNodeId, const UA_NodeId* destinationNodeId,
                     UA_InstantiationCallback* instantiationCallback) {
    /* Browse to get all children */
    UA_BrowseDescription bd;
    UA_BrowseDescription_init(&bd);
    bd.nodeId = *sourceNodeId;
    bd.referenceTypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_AGGREGATES);
    bd.includeSubtypes = true;
    bd.browseDirection = UA_BROWSEDIRECTION_FORWARD;
    bd.nodeClassMask = UA_NODECLASS_OBJECT | UA_NODECLASS_VARIABLE | UA_NODECLASS_METHOD;
    bd.resultMask = UA_BROWSERESULTMASK_REFERENCETYPEID | UA_BROWSERESULTMASK_NODECLASS |
        UA_BROWSERESULTMASK_BROWSENAME;

    UA_BrowseResult br;
    UA_BrowseResult_init(&br);
    Service_Browse_single(server, session, NULL, &bd, 0, &br);
    if(br.statusCode != UA_STATUSCODE_GOOD)
        return br.statusCode;

    /* Copy all children */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_NodeId existingChild = UA_NODEID_NULL;
    for(size_t i = 0; i < br.referencesSize; ++i) {
        UA_ReferenceDescription *rd = &br.references[i];

        /* Is the child mandatory? If not, skip */
        if(!mandatoryChild(server, session, &rd->nodeId.nodeId))
            continue;

        /* TODO: If a child is optional, check whether optional children that
         * were manually added fit the constraints. */

        /* Check for deduplication */
        retval = instanceFindAggregateByBrowsename(server, session, destinationNodeId,
                                                   &rd->browseName, &existingChild);
        if(retval != UA_STATUSCODE_GOOD)
            break;

        if(UA_NodeId_equal(&UA_NODEID_NULL, &existingChild)) {
            /* New node in child */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* add a reference to the method in the objecttype */
                UA_AddReferencesItem newItem;
                UA_AddReferencesItem_init(&newItem);
                newItem.sourceNodeId = *destinationNodeId;
                newItem.referenceTypeId = rd->referenceTypeId;
                newItem.isForward = true;
                newItem.targetNodeId = rd->nodeId;
                newItem.targetNodeClass = UA_NODECLASS_METHOD;
                retval = addReference(server, session, &newItem);
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE)
                retval = copyExistingVariable(server, session, &rd->nodeId.nodeId,
                                              &rd->referenceTypeId, destinationNodeId,
                                              instantiationCallback);
            else if(rd->nodeClass == UA_NODECLASS_OBJECT)
                retval = copyExistingObject(server, session, &rd->nodeId.nodeId,
                                            &rd->referenceTypeId, destinationNodeId,
                                            instantiationCallback);
        } else {
            /* Preexistent node in child
             * General strategy if we meet an already existing node:
             * - Preexistent variable contents always 'win' overwriting anything
             *   supertypes would instantiate
             * - Always copy contents of template *into* existant node (merge
             *   contents of e.g. Folders like ParameterSet) */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* Do nothing, existent method wins */
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE ||
                      rd->nodeClass == UA_NODECLASS_OBJECT) {
                if(!UA_NodeId_equal(&rd->nodeId.nodeId, &existingChild))
                    retval = copyChildNodesToNode(server, session, &rd->nodeId.nodeId,
                                                  &existingChild, instantiationCallback);
            }
            UA_NodeId_deleteMembers(&existingChild);
        }
        if(retval != UA_STATUSCODE_GOOD)
            break;
    }
    UA_BrowseResult_deleteMembers(&br);
    return retval;
}